

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::compute_enthalpy_fluxes(PeleLM *this,MultiFab **flux,MultiFab **beta,Real time)

{
  Geometry *__src;
  int *piVar1;
  DistributionMapping *dm;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> amrlevel;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Long LVar6;
  Long LVar7;
  Long LVar8;
  int i;
  FabType FVar9;
  StateDescriptor *this_00;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *pVVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  BoxArray *pBVar15;
  pointer *ppbVar16;
  double *pdVar17;
  ostream *os_;
  Print *pPVar18;
  int n;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  double *pdVar34;
  _Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this_01;
  int j;
  uint uVar35;
  long lVar36;
  double *pdVar37;
  bool bVar38;
  int iVar41;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar43 [16];
  double dVar44;
  int iVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  double *local_1248;
  double *local_1230;
  Box local_11a4;
  Array4<const_double> local_1188;
  Box local_1144;
  MFIter mfi;
  Array4<double> local_10c8;
  int *local_1088;
  double local_1080;
  Geometry *local_1078;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  LPInfo local_1058;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1028;
  double dStack_1010;
  double local_1008;
  Vector<int,_std::allocator<int>_> *pVStack_1000;
  Vector<int,_std::allocator<int>_> *local_ff8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_ff0;
  Vector<int,_std::allocator<int>_> *local_fe8;
  Vector<int,_std::allocator<int>_> *pVStack_fe0;
  double local_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double local_fb8;
  double dStack_fb0;
  undefined1 local_fa8 [16];
  double local_f98;
  MultiFab TT;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_d18 [2];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  element_type *local_cd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_cd0;
  element_type *local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_cc0;
  element_type *local_cb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_cb0;
  pointer local_ca8;
  pointer piStack_ca0;
  pointer local_c98;
  _Bit_type *p_Stack_c90;
  float local_c88 [56];
  MultiFab local_ba8;
  MultiFab local_a28;
  MultiFab Enth;
  MultiFab TTc;
  MLMG mg;
  MLEBABecLap op;
  
  local_1080 = amrex::ParallelDescriptor::second();
  local_1058.do_semicoarsening = false;
  local_1058.agg_grid_size = -1;
  local_1058.con_grid_size = -1;
  local_1058.do_agglomeration = true;
  local_1058.do_consolidation = true;
  local_1058.has_metric_term = false;
  local_1058.max_coarsening_level = 0;
  local_1058.max_semicoarsening_level = 0;
  local_1058.semicoarsening_direction = -1;
  local_1058.hidden_direction = -1;
  local_1188.p = (double *)
                 __dynamic_cast(*(undefined8 *)
                                 ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                        amr_level).
                                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        .
                                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(this->super_NavierStokesBase).super_AmrLevel.level]._M_t.
                                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + 0x218),&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                                &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_1188.p == (double *)0x0) {
    __cxa_bad_cast();
  }
  __src = &(this->super_NavierStokesBase).super_AmrLevel.geom;
  memcpy((iterator)&mlmg_lobc,__src,200);
  __l._M_len = 1;
  __l._M_array = (iterator)&mlmg_lobc;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_hibc,__l,
             (allocator_type *)&local_10c8);
  pBVar15 = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  amrex::BoxArray::BoxArray((BoxArray *)&mg,pBVar15);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&mg;
  local_1078 = __src;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&TTc,__l_00,
             (allocator_type *)&local_11a4);
  dm = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&mfi,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&mfi;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)&TT,
             __l_01,(allocator_type *)&local_1144);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1188;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&Enth,__l_02,(allocator_type *)&math_bc);
  amrex::MLEBABecLap::MLEBABecLap
            (&op,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_hibc,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&TTc,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)&TT,
             &local_1058,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&Enth,1);
  std::
  _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                   *)&Enth);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)&TT)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mfi.fabArray);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&TTc);
  amrex::BoxArray::~BoxArray((BoxArray *)&mg);
  std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
            ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_hibc);
  op.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder =
       Diffusion::maxOrder((this->super_NavierStokesBase).diffusion);
  amrex::MLMG::MLMG(&mg,(MLLinOp *)&op);
  this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
  pVVar10 = amrex::StateDescriptor::getBCs(this_00);
  Diffusion::setDomainBC
            (&mlmg_lobc,&mlmg_hibc,
             (pVVar10->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start + NavierStokesBase::Temp);
  piVar1 = &(this->super_NavierStokesBase).super_AmrLevel.level;
  amrex::MLLinOp::setDomainBC((MLLinOp *)&op,&mlmg_lobc,&mlmg_hibc);
  amrex::MultiFab::MultiFab(&TTc);
  local_1088 = piVar1;
  if (0 < (long)*piVar1) {
    amrlevel.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[(long)*piVar1 + -1]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    mlmg_lobc._M_elems[0] = 1;
    mlmg_lobc._M_elems[1] = interior;
    stack0xfffffffffffff2e0 = (Arena *)0x0;
    avStack_d18[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_d18[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_d18[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&TTc,(BoxArray *)
                    ((long)amrlevel.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
               (DistributionMapping *)
               ((long)amrlevel.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,0,
               (MFInfo *)&mlmg_lobc,
               (FabFactory<amrex::FArrayBox> *)
               (((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)((long)amrlevel.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
               _M_t).
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_d18);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)
               amrlevel.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
               super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&TTc,0,time,0,
               NavierStokesBase::Temp,1,0);
    amrex::MLLinOp::setCoarseFineBC
              ((MLLinOp *)&op,&TTc,(this->super_NavierStokesBase).super_AmrLevel.crse_ratio.vect[0])
    ;
  }
  mlmg_lobc._M_elems[0] = 1;
  mlmg_lobc._M_elems[1] = interior;
  stack0xfffffffffffff2e0 = (Arena *)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (&TT,pBVar15,dm,1,1,(MFInfo *)&mlmg_lobc,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_d18);
  amrex::AmrLevel::FillPatch((AmrLevel *)this,&TT,1,time,0,NavierStokesBase::Temp,1,0);
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)&op,0,&TT,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0);
  amrex::MLEBABecLap::setScalars(&op,0.0,1.0);
  Diffusion::setBeta(&op,beta,0x15,1);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&(*flux)->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&flux[1]->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&flux[2]->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,0);
  Diffusion::computeExtensiveFluxes
            (&mg,&TT,flux,0x17,1,(MultiFab *)&(this->super_NavierStokesBase).field_0x540,1.0);
  mlmg_lobc._M_elems[0] = 1;
  mlmg_lobc._M_elems[1] = interior;
  stack0xfffffffffffff2e0 = (Arena *)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_d18[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (&Enth,pBVar15,dm,0x15,1,(MFInfo *)&mlmg_lobc,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_d18);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&Enth,true);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_11a4,&mfi,-1000000);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1188,&TT.super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_10c8,&Enth.super_FabArray<amrex::FArrayBox>,&mfi,0);
    LVar8 = local_10c8.nstride;
    LVar7 = local_10c8.kstride;
    LVar6 = local_10c8.jstride;
    pdVar28 = local_1188.p;
    iVar45 = local_11a4.bigend.vect[0];
    iVar41 = local_11a4.smallend.vect[0];
    lVar25 = CONCAT44(local_1188.jstride._4_4_,(int)local_1188.jstride);
    lVar30 = CONCAT44(local_1188.kstride._4_4_,(int)local_1188.kstride);
    lVar36 = (long)local_1188.begin.x;
    lVar11 = (long)local_1188.begin.y;
    lVar12 = (long)local_1188.begin.z;
    lVar29 = (long)local_11a4.smallend.vect[1];
    lVar31 = (long)local_11a4.smallend.vect[2];
    lVar23 = (long)local_11a4.smallend.vect[0];
    local_1230 = (double *)
                 ((lVar31 - local_10c8.begin.z) * local_10c8.kstride * 8 +
                  (lVar29 - local_10c8.begin.y) * local_10c8.jstride * 8 + lVar23 * 8 +
                  (long)local_10c8.begin.x * -8 + (long)local_10c8.p);
    lVar19 = (long)local_11a4.bigend.vect[1];
    lVar20 = (long)local_11a4.bigend.vect[2];
    iVar27 = local_11a4.bigend.vect[0] + 1;
    for (; lVar31 <= lVar20; lVar31 = lVar31 + 1) {
      local_1248 = local_1230;
      for (lVar21 = lVar29; lVar21 <= lVar19; lVar21 = lVar21 + 1) {
        if (iVar41 <= iVar45) {
          lVar24 = lVar23;
          pdVar33 = local_1248;
          do {
            memset(&mlmg_hibc,0,0xa8);
            dVar39 = pdVar28[(lVar31 - lVar12) * lVar30 +
                             (lVar21 - lVar11) * lVar25 + (lVar24 - lVar36)];
            dVar46 = dVar39 * dVar39;
            dVar44 = dVar39 * dVar46;
            dVar42 = dVar39 * dVar44;
            mlmg_lobc._M_elems[0] = 0xefbefbf0;
            mlmg_lobc._M_elems[1] = 0x3fdfbefb;
            stack0xfffffffffffff2e0 = (Arena *)0x3fefbefbefbefbf0;
            avStack_d18[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
            avStack_d18[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
            avStack_d18[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe;
            avStack_d18[1].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fac6bb6f569cbd9;
            avStack_d18[1].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f9f065042c3dbd3;
            avStack_d18[1].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb24021df7a429e;
            local_ce8 = 0.07129108148570615;
            uStack_ce0 = 0.06651147322913202;
            local_cd8 = (element_type *)0x3fafea0b02aa32d7;
            _Stack_cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa24778bbe8f7dd;
            local_cc8 = (element_type *)0x3f9744998b9a1c0d;
            _Stack_cc0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa1a4eba7fd99b3;
            local_cb8 = (element_type *)0x3fa10d488e47ecc4;
            _Stack_cb0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa07f7f2eefd932;
            local_ca8 = (pointer)0x3fa24021df7a429e;
            piStack_ca0 = (pointer)0x3fa19e14f6ff5920;
            local_c98 = (pointer)0x3fa106e55a53f15b;
            p_Stack_c90 = (_Bit_type *)0x3fa246cdaf410bdd;
            local_c88[0] = 6.940039e+19;
            local_c88[1] = 1.2002503;
            dVar47 = 1.0 / dVar39;
            if (1000.0 <= dVar39) {
              mlmg_hibc._M_elems._0_8_ =
                   dVar47 * -950.158922 +
                   dVar42 * 4.00510752e-15 +
                   dVar44 * -4.48915985e-11 +
                   dVar46 * 1.66485593e-07 + dVar39 * -2.47012365e-05 + 3.3372792;
              stack0xffffffffffffefd0 =
                   (FabArrayBase *)
                   (dVar47 * 25473.6599 +
                   dVar42 * 9.96394714e-23 +
                   dVar44 * -1.18378809e-18 +
                   dVar46 * 5.38539827e-15 + dVar39 * -1.15421486e-11 + 2.50000001);
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(dVar47 * 29217.5791 +
                            dVar42 * 2.45667382e-16 +
                            dVar44 * -2.50444497e-12 +
                            dVar46 * 1.39828196e-08 + dVar39 * -4.29870569e-05 + 2.56942078);
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(dVar47 * -1088.45772 +
                            dVar42 * -4.33435588e-15 +
                            dVar44 * 5.23676387e-11 +
                            dVar46 * -2.52655556e-07 + dVar39 * 0.00074154377 + 3.28253784);
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(dVar47 * 3858.657 +
                            dVar42 * 2.34824752e-15 +
                            dVar44 * -2.19865389e-11 +
                            dVar46 * 4.21684093e-08 + dVar39 * 0.000274214858 + 3.09288767);
              dStack_1010 = dVar47 * -30004.2971 +
                            dVar42 * 3.36401984e-15 +
                            dVar44 * -2.42604967e-11 +
                            dVar46 * -5.46908393e-08 + dVar39 * 0.00108845902 + 3.03399249;
              local_1008 = dVar47 * 111.856713 +
                           dVar42 * -2.1581707e-15 +
                           dVar44 * 2.85615925e-11 +
                           dVar46 * -2.11219383e-07 + dVar39 * 0.00111991006 + 4.0172109;
              pVStack_1000 = (Vector<int,_std::allocator<int>_> *)
                             (dVar47 * 46263.604 +
                             dVar42 * -3.75455134e-15 +
                             dVar44 * 6.50448872e-11 +
                             dVar46 * -4.69648657e-07 + dVar39 * 0.00182819646 + 2.87410113);
              local_ff8 = (Vector<int,_std::allocator<int>_> *)
                          (dVar47 * 50925.9997 +
                          dVar42 * -6.7943273e-15 +
                          dVar44 * 1.044765e-10 +
                          dVar46 * -6.70639823e-07 + dVar39 * 0.00232794318 + 2.29203842);
              pVStack_ff0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                            (dVar47 * 16775.5843 +
                            dVar42 * -9.34308788e-15 +
                            dVar44 * 1.48921161e-10 +
                            dVar46 * -9.95714493e-07 + dVar39 * 0.00361995018 + 2.28571772);
              local_fe8 = (Vector<int,_std::allocator<int>_> *)
                          (dVar47 * -9468.34459 +
                          dVar42 * -2.0363046e-14 +
                          dVar44 * 3.05731338e-10 +
                          dVar46 * -1.9109527e-06 + dVar39 * 0.00669547335 + 0.074851495);
              pVStack_fe0 = (Vector<int,_std::allocator<int>_> *)
                            (dVar47 * -14151.8724 +
                            dVar42 * -4.07295432e-15 +
                            dVar44 * 5.7513252e-11 +
                            dVar46 * -3.32941924e-07 + dVar39 * 0.00103126372 + 2.71518561);
              local_fd8 = dVar47 * -48759.166 +
                          dVar42 * -9.44168328e-15 +
                          dVar44 * 1.30872547e-10 +
                          dVar46 * -7.38271347e-07 + dVar39 * 0.00220718513 + 3.85746029;
              dStack_fd0 = dVar47 * 4011.91815 +
                           dVar42 * -1.06701742e-14 +
                           dVar44 * 1.47290445e-10 +
                           dVar46 * -8.28152043e-07 + dVar39 * 0.00247847763 + 2.77217438;
              local_fc8 = dVar47 * -13995.8323 +
                          dVar42 * -1.76771128e-14 +
                          dVar44 * 2.5160303e-10 +
                          dVar46 * -1.47419604e-06 + dVar39 * 0.00460000041 + 1.76069008;
              dStack_fc0 = dVar47 * 127.83252 +
                           dVar42 * -4.225232e-15 +
                           dVar44 * 9.8610775e-11 +
                           dVar46 * -8.85461333e-07 + dVar39 * 0.0039357485 + 3.770799;
              local_fb8 = dVar47 * 4939.88614 +
                          dVar42 * -2.51412122e-14 +
                          dVar44 * 3.68057308e-10 +
                          dVar46 * -2.23692638e-06 + dVar39 * 0.00732270755 + 2.03611116;
              dStack_fb0 = dVar47 * 12857.52 +
                           dVar42 * -2.99283152e-14 +
                           dVar44 * 4.38044223e-10 +
                           dVar46 * -2.66068889e-06 + dVar39 * 0.0086986361 + 1.95465642;
              dVar48 = dVar42 * -3.8000578e-14 +
                       dVar44 * 5.53530003e-10 +
                       dVar46 * -3.3418689e-06 + dVar39 * 0.0108426339 + 1.0718815;
              dVar49 = dVar42 * -1.3506702e-15 +
                       dVar44 * 2.5242595e-11 +
                       dVar46 * -1.89492e-07 + dVar39 * 0.0007439884 + 2.92664;
              dVar2 = -11426.3932;
              dVar3 = -922.7977;
            }
            else {
              mlmg_hibc._M_elems._0_8_ =
                   dVar47 * -917.935173 +
                   dVar42 * -1.47522352e-12 +
                   dVar44 * 5.03930235e-09 +
                   dVar46 * -6.492717e-06 + dVar39 * 0.00399026037 + 2.34433112;
              stack0xffffffffffffefd0 =
                   (FabArrayBase *)
                   (dVar47 * 25473.6599 +
                   dVar42 * -1.85546466e-22 +
                   dVar44 * 5.7520408e-19 + dVar46 * -6.65306547e-16 + dVar39 * 3.52666409e-13 + 2.5
                   );
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(dVar47 * 29122.2592 +
                            dVar42 * 4.22531942e-13 +
                            dVar44 * -1.53201656e-09 +
                            dVar46 * 2.21435465e-06 + dVar39 * -0.00163965942 + 3.1682671);
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(dVar47 * -1063.94356 +
                            dVar42 * 6.48745674e-13 +
                            dVar44 * -2.42032377e-09 +
                            dVar46 * 3.282434e-06 + dVar39 * -0.00149836708 + 3.78245636);
              local_1028.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(dVar47 * 3615.08056 +
                            dVar42 * 2.7282294e-13 +
                            dVar44 * -9.70283332e-10 +
                            dVar46 * 1.5393128e-06 + dVar39 * -0.00120065876 + 3.99201543);
              dStack_1010 = dVar47 * -30293.7267 +
                            dVar42 * 3.54395634e-13 +
                            dVar44 * -1.37199266e-09 +
                            dVar46 * 2.17346737e-06 + dVar39 * -0.00101821705 + 4.19864056;
              local_1008 = dVar47 * 294.80804 +
                           dVar42 * 1.85845025e-12 +
                           dVar44 * -6.06909735e-09 +
                           dVar46 * 7.05276303e-06 + dVar39 * -0.00237456025 + 4.30179801;
              pVStack_1000 = (Vector<int,_std::allocator<int>_> *)
                             (dVar47 * 46004.0401 +
                             dVar42 * 3.37483438e-13 +
                             dVar44 * -9.62727883e-10 +
                             dVar46 * 9.31632803e-07 + dVar39 * 0.000484436072 + 3.76267867);
              local_ff8 = (Vector<int,_std::allocator<int>_> *)
                          (dVar47 * 50496.8163 +
                          dVar42 * 3.88629474e-13 +
                          dVar44 * -1.67203995e-09 +
                          dVar46 * 2.74432073e-06 + dVar39 * -0.0011833071 + 4.19860411);
              pVStack_ff0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                            (dVar47 * 16444.9988 +
                            dVar42 * 5.08771468e-13 +
                            dVar44 * -1.71779356e-09 +
                            dVar46 * 1.91007285e-06 + dVar39 * 0.00100547588 + 3.6735904);
              local_fe8 = (Vector<int,_std::allocator<int>_> *)
                          (dVar47 * -10246.6476 +
                          dVar42 * 3.33387912e-12 +
                          dVar44 * -1.21185757e-08 +
                          dVar46 * 1.63933533e-05 + dVar39 * -0.0068354894 + 5.14987613);
              pVStack_fe0 = (Vector<int,_std::allocator<int>_> *)
                            (dVar47 * -14344.086 +
                            dVar42 * -1.808849e-13 +
                            dVar44 * 2.26751471e-10 +
                            dVar46 * 3.3893811e-07 + dVar39 * -0.00030517684 + 3.57953347);
              local_fd8 = dVar47 * -48371.9697 +
                          dVar42 * -2.87399096e-14 +
                          dVar44 * 6.14797555e-10 +
                          dVar46 * -2.3745209e-06 + dVar39 * 0.00449229839 + 2.35677352;
              dStack_fd0 = dVar47 * 3839.56496 +
                           dVar42 * 8.6753773e-13 +
                           dVar44 * -3.32860233e-09 +
                           dVar46 * 4.59331487e-06 + dVar39 * -0.00162196266 + 4.22118584;
              local_fc8 = dVar47 * -14308.9567 +
                          dVar42 * 2.63545304e-12 +
                          dVar44 * -9.48213152e-09 +
                          dVar46 * 1.24406669e-05 + dVar39 * -0.00495416684 + 4.79372315;
              dStack_fc0 = dVar47 * 978.6011 +
                           dVar42 * 4.15122e-13 +
                           dVar44 * -1.844409e-09 +
                           dVar46 * 1.77949067e-06 + dVar39 * 0.0036082975 + 2.106204;
              local_fb8 = dVar47 * 5089.77593 +
                          dVar42 * 5.39768746e-12 +
                          dVar44 * -1.72897188e-08 +
                          dVar46 * 1.90330097e-05 + dVar39 * -0.00378526124 + 3.95920148;
              dStack_fb0 = dVar47 * 12841.6265 +
                           dVar42 * 4.61018008e-12 +
                           dVar44 * -1.49781651e-08 +
                           dVar46 * 1.65714269e-05 + dVar39 * -0.00209329446 + 4.30646568;
              dVar48 = dVar42 * 5.37371542e-12 +
                       dVar44 * -1.77116571e-08 +
                       dVar46 * 1.99812763e-05 + dVar39 * -0.00275077135 + 4.29142492;
              dVar49 = dVar42 * -4.889708e-13 +
                       dVar44 * 1.41037875e-09 +
                       dVar46 * -1.321074e-06 + dVar39 * 0.0007041202 + 3.298677;
              dVar2 = -11522.2055;
              dVar3 = -1020.8999;
            }
            dVar49 = dVar47 * dVar3 + dVar49;
            local_fa8._8_4_ = SUB84(dVar49,0);
            local_fa8._0_8_ = dVar47 * dVar2 + dVar48;
            local_fa8._12_4_ = (int)((ulong)dVar49 >> 0x20);
            local_f98 = dVar47 * -745.375 +
                        dVar42 * 0.0 + dVar44 * 0.0 + dVar46 * 0.0 + dVar39 * 0.0 + 2.5;
            for (lVar13 = 0; lVar13 != 0x15; lVar13 = lVar13 + 1) {
              *(double *)(mlmg_hibc._M_elems + lVar13 * 2) =
                   *(double *)(mlmg_lobc._M_elems + lVar13 * 2) * dVar39 * 83144626.1815324 *
                   *(double *)(mlmg_hibc._M_elems + lVar13 * 2);
            }
            pdVar14 = pdVar33;
            for (lVar13 = 0; lVar13 != 0x15; lVar13 = lVar13 + 1) {
              *pdVar14 = *(double *)(mlmg_hibc._M_elems + lVar13 * 2) * 0.0001;
              pdVar14 = pdVar14 + LVar8;
            }
            lVar24 = lVar24 + 1;
            pdVar33 = pdVar33 + 1;
          } while (iVar27 != (int)lVar24);
        }
        local_1248 = local_1248 + LVar6;
      }
      local_1230 = local_1230 + LVar7;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0x15,
             (allocator_type *)&mlmg_lobc);
  NavierStokesBase::fetchBCArray
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&mlmg_lobc,
             &this->super_NavierStokesBase,0,first_spec,0x15);
  this_01 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&mlmg_lobc;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
            (&math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,this_01);
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base(this_01);
  lVar25 = 0;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)((long)mlmg_lobc._M_elems + lVar25));
    lVar25 = lVar25 + 0x180;
  } while (lVar25 != 0x480);
  for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
    pBVar15 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)this,(int)lVar25);
    mlmg_hibc._M_elems[0] = 1;
    mlmg_hibc._M_elems[1] = interior;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stack0xffffffffffffefd0 = (FabArrayBase *)0x0;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (**(code **)(((this_01->_M_impl).super__Vector_impl_data._M_start)->bc + 4))
              (this_01,pBVar15,dm,0x15,1,&mlmg_hibc,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1028);
    this_01 = this_01 + 0x10;
  }
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (&Enth,(MultiFab *)&mlmg_lobc,&local_ba8,&local_a28,0,0,0x15,local_1078,&math_bc);
  amrex::MFIter::MFIter((MFIter *)&mlmg_hibc,(FabArrayBase *)&TT,true);
  while( true ) {
    if (dStack_1010._0_4_ <=
        (int)local_1028.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
    amrex::MFIter::tilebox(&local_11a4,(MFIter *)&mlmg_hibc);
    ppbVar16 = &local_1028.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_ff8 != (Vector<int,_std::allocator<int>_> *)0x0) {
      ppbVar16 = (pointer *)
                 ((local_ff8->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start +
                 (int)local_1028.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
         local_11a4.smallend.vect[1];
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
         local_11a4.smallend.vect[0];
    mfi.tile_size.vect[0] = local_11a4.bigend.vect[1];
    mfi.tile_size.vect[1] = local_11a4.bigend.vect[2];
    mfi.tile_size.vect[2] = local_11a4.btype.itype;
    mfi.fabArray._0_4_ = local_11a4.smallend.vect[2];
    mfi.fabArray._4_4_ = local_11a4.bigend.vect[0];
    FVar9 = amrex::EBCellFlagFab::getType
                      ((EBCellFlagFab *)
                       TT.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar16][1].
                       super_BaseFab<double>._vptr_BaseFab,(Box *)&mfi);
    if (FVar9 == covered) {
      for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
        amrex::MFIter::nodaltilebox((Box *)&local_1188,(MFIter *)&mlmg_hibc,(int)lVar25);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&mfi,&flux[lVar25]->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&mlmg_hibc,0x16);
        auVar5 = _DAT_006f8e90;
        auVar4 = _DAT_006f8e80;
        lVar12 = (long)(int)local_1188.jstride;
        uVar35 = local_1188.jstride._4_4_ - (int)local_1188.p;
        auVar40._4_4_ = 0;
        auVar40._0_4_ = uVar35;
        auVar40._8_4_ = uVar35;
        auVar40._12_4_ = 0;
        lVar11 = CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]) * 8;
        lVar30 = CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) * 8;
        lVar31 = (long)mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                 ((long)local_1188.p._4_4_ - (long)mfi.beginIndex) * lVar30 +
                 (lVar12 - mfi.endIndex) * lVar11 + (long)(int)local_1188.p * 8 +
                 (long)mfi.currentIndex * -8 + 8;
        auVar40 = auVar40 ^ _DAT_006f8e90;
        for (; lVar19 = lVar31, lVar20 = (long)local_1188.p._4_4_,
            lVar12 <= local_1188.kstride._4_4_; lVar12 = lVar12 + 1) {
          for (; lVar20 <= (int)local_1188.kstride; lVar20 = lVar20 + 1) {
            if ((int)local_1188.p <= local_1188.jstride._4_4_) {
              uVar26 = 0;
              do {
                auVar43._8_4_ = (int)uVar26;
                auVar43._0_8_ = uVar26;
                auVar43._12_4_ = (int)(uVar26 >> 0x20);
                auVar43 = (auVar43 | auVar4) ^ auVar5;
                bVar38 = auVar40._0_4_ < auVar43._0_4_;
                iVar41 = auVar40._4_4_;
                iVar45 = auVar43._4_4_;
                if ((bool)(~(iVar41 < iVar45 || iVar45 == iVar41 && bVar38) & 1)) {
                  *(undefined8 *)(lVar19 + -8 + uVar26 * 8) = 0x462f29c4eeb155e5;
                }
                if (iVar41 >= iVar45 && (iVar45 != iVar41 || !bVar38)) {
                  *(undefined8 *)(lVar19 + uVar26 * 8) = 0x462f29c4eeb155e5;
                }
                uVar26 = uVar26 + 2;
              } while (((ulong)uVar35 + 2 & 0xfffffffffffffffe) != uVar26);
            }
            lVar19 = lVar19 + lVar30;
          }
          lVar31 = lVar31 + lVar11;
        }
      }
    }
    else {
      for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
        amrex::MFIter::nodaltilebox(&local_1144,(MFIter *)&mlmg_hibc,(int)lVar25);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&mfi,&flux[lVar25]->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&mlmg_hibc,0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_1188,&flux[lVar25]->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&mlmg_hibc,0x16);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_10c8,(FabArray<amrex::FArrayBox> *)(&mlmg_lobc + lVar25 * 0x20),
                   (MFIter *)&mlmg_hibc);
        lVar11 = (long)local_1144.smallend.vect[1];
        lVar12 = (long)local_1144.smallend.vect[2];
        lVar30 = (long)local_1144.smallend.vect[0];
        pdVar28 = (double *)
                  ((lVar12 - local_10c8.begin.z) * local_10c8.kstride * 8 +
                   (lVar11 - local_10c8.begin.y) * local_10c8.jstride * 8 + lVar30 * 8 +
                   (long)local_10c8.begin.x * -8 + (long)local_10c8.p);
        pdVar33 = (double *)
                  ((lVar12 - mfi.endIndex) *
                   CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]) * 8 +
                   (lVar11 - mfi.beginIndex) * CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) * 8 +
                   lVar30 * 8 + (long)mfi.currentIndex * -8 +
                  (long)mfi.m_fa._M_t.
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
        for (; lVar12 <= local_1144.bigend.vect[2]; lVar12 = lVar12 + 1) {
          lVar19 = (lVar12 - local_1188.begin.z) *
                   CONCAT44(local_1188.kstride._4_4_,(int)local_1188.kstride);
          pdVar14 = pdVar28;
          pdVar34 = pdVar33;
          for (lVar31 = lVar11; lVar31 <= local_1144.bigend.vect[1]; lVar31 = lVar31 + 1) {
            if (local_1144.smallend.vect[0] <= local_1144.bigend.vect[0]) {
              lVar23 = (lVar31 - local_1188.begin.y) *
                       CONCAT44(local_1188.jstride._4_4_,(int)local_1188.jstride);
              pdVar32 = pdVar34;
              lVar20 = lVar30;
              pdVar37 = pdVar14;
              do {
                local_1188.p[lVar19 + lVar23 + (lVar20 - local_1188.begin.x)] = 0.0;
                dVar39 = 0.0;
                lVar29 = 0x15;
                pdVar17 = pdVar32;
                pdVar22 = pdVar37;
                while (bVar38 = lVar29 != 0, lVar29 = lVar29 + -1, bVar38) {
                  dVar39 = dVar39 + *pdVar17 * *pdVar22;
                  local_1188.p[lVar19 + lVar23 + (lVar20 - local_1188.begin.x)] = dVar39;
                  pdVar22 = pdVar22 + local_10c8.nstride;
                  pdVar17 = pdVar17 + CONCAT44(mfi._28_4_,mfi.tile_size.vect[2]);
                }
                lVar20 = lVar20 + 1;
                pdVar37 = pdVar37 + 1;
                pdVar32 = pdVar32 + 1;
              } while (local_1144.bigend.vect[0] + 1 != (int)lVar20);
            }
            pdVar14 = pdVar14 + local_10c8.jstride;
            pdVar34 = pdVar34 + CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray);
          }
          pdVar28 = pdVar28 + local_10c8.kstride;
          pdVar33 = pdVar33 + CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]);
        }
      }
    }
    amrex::MFIter::operator++((MFIter *)&mlmg_hibc);
  }
  amrex::MFIter::~MFIter((MFIter *)&mlmg_hibc);
  if (3 < NavierStokesBase::verbose) {
    dVar39 = amrex::ParallelDescriptor::second();
    os_ = amrex::OutStream();
    amrex::Print::Print((Print *)&mlmg_hibc,os_);
    std::operator<<((ostream *)&local_1028,"      PeleLM::compute_enthalpy_fluxes(): lev: ");
    pPVar18 = amrex::Print::operator<<((Print *)&mlmg_hibc,local_1088);
    std::operator<<((ostream *)&pPVar18->ss,", time: ");
    std::ostream::_M_insert<double>(dVar39 - local_1080);
    std::operator<<((ostream *)&pPVar18->ss,'\n');
    amrex::Print::~Print((Print *)&mlmg_hibc);
  }
  lVar25 = 0x300;
  do {
    amrex::MultiFab::~MultiFab((MultiFab *)((long)mlmg_lobc._M_elems + lVar25));
    lVar25 = lVar25 + -0x180;
  } while (lVar25 != -0x180);
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&math_bc);
  amrex::MultiFab::~MultiFab(&Enth);
  amrex::MultiFab::~MultiFab(&TT);
  amrex::MultiFab::~MultiFab(&TTc);
  amrex::MLMG::~MLMG(&mg);
  amrex::MLEBABecLap::~MLEBABecLap(&op);
  return;
}

Assistant:

void
PeleLM::compute_enthalpy_fluxes (MultiFab* const*       flux,
                                 const MultiFab* const* beta,
                                 Real                   time)
{
  BL_PROFILE("PLM::compute_enthalpy_fluxes()");
  /*
    Build heat fluxes based on species fluxes, Gamma_m, and fill-patched cell-centered states
    Set:
         flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)
         flux[NUM_SPECIES+2] = - lambda grad T
  */

  AMREX_ASSERT(beta && beta[0]->nComp() == NUM_SPECIES+1);

  const Real strt_time = ParallelDescriptor::second();

  //
  // First step, we create an operator to get (EB-aware) fluxes from, it will provide flux[NUM_SPECIES+2]
  //

  LPInfo info;
  info.setAgglomeration(1);
  info.setConsolidation(1);
  info.setMetricTerm(false);
  info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
  const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>((parent->getLevel(level)).Factory());
  MLEBABecLap op({geom}, {grids}, {dmap}, info, {ebf});
#else
  MLABecLaplacian op({geom}, {grids}, {dmap}, info);
#endif

  op.setMaxOrder(diffusion->maxOrder());
  MLMG mg(op);

  {
    const Vector<BCRec>& theBCs = AmrLevel::desc_lst[State_Type].getBCs();
    const BCRec& bc = theBCs[Temp];

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    Diffusion::setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    op.setDomainBC(mlmg_lobc, mlmg_hibc);
  }

  MultiFab TTc;
  if (level > 0)
  {
    PeleLM& clev = getLevel(level-1);
    TTc.define(clev.grids,clev.dmap,1,0,MFInfo(),clev.Factory());
    FillPatch(clev,TTc,0,time,State_Type,Temp,1,0);
    op.setCoarseFineBC(&TTc, crse_ratio[0]);
  }
  int ngrow = 1;
  MultiFab TT(grids,dmap,1,ngrow,MFInfo(),Factory());
  FillPatch(*this,TT,ngrow,time,State_Type,Temp,1,0);
  op.setLevelBC(0, &TT);

  // Creating alpha and beta coefficients.
  Real      a               = 0;
  Real      b               = 1.;
  op.setScalars(a, b);


  // Here it is NUM_SPECIES because lambda is stored after the last species (first starts at 0)
  Diffusion::setBeta(op,beta,NUM_SPECIES);

  AMREX_D_TERM( flux[0]->setVal(0., NUM_SPECIES+2, 1);,
                flux[1]->setVal(0., NUM_SPECIES+2, 1);,
                flux[2]->setVal(0., NUM_SPECIES+2, 1););

  // Here it is NUM_SPECIES+2 because this is the heat flux (NUM_SPECIES+3 in enth_diff_terms in fortran)
  // No multiplication by dt here
  diffusion->computeExtensiveFluxes(mg, TT, flux, NUM_SPECIES+2, 1, area, b);

  //
  // Now we have flux[NUM_SPECIES+2]
  // Second step, let's compute flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)


   // First we want to gather h_i from T and then interpolate it to face centroids
   MultiFab Enth(grids,dmap,NUM_SPECIES,ngrow,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& gbx = mfi.growntilebox();
       auto const& T  = TT.const_array(mfi);
       auto const& Hi = Enth.array(mfi,0);

       amrex::ParallelFor(gbx, [T, Hi]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          getHGivenT( i, j, k, T, Hi );
       });
   }

  Vector<BCRec> math_bc(NUM_SPECIES);
  math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

  MultiFab enth_edgstate[AMREX_SPACEDIM];

  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    const BoxArray& ba = getEdgeBoxArray(idim);
    enth_edgstate[idim].define(ba, dmap, NUM_SPECIES, 1, MFInfo(), Factory());
  }

#ifdef AMREX_USE_EB
   EB_interp_CellCentroid_to_FaceCentroid(Enth, AMREX_D_DECL(enth_edgstate[0],enth_edgstate[1],enth_edgstate[2]), 0, 0, NUM_SPECIES, geom, math_bc);

#else
   const Box& domain = geom.Domain();
   bool use_harmonic_avg = def_harm_avg_cen2edge ? true : false;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
      {
         const Box ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         const auto& enth_c  = Enth.array(mfi,0);
         const auto& enth_ed = enth_edgstate[dir].array(mfi,0);
         const auto bc_lo = fpi_phys_loc(math_bc[0].lo(dir));
         const auto bc_hi = fpi_phys_loc(math_bc[0].hi(dir));
         amrex::ParallelFor(ebx, [dir, bc_lo, bc_hi, use_harmonic_avg, enth_c, enth_ed, edomain]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc_lo == HT_Edge ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc_hi == HT_Edge ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            cen2edg_cpp( i, j, k, dir, NUM_SPECIES, use_harmonic_avg, on_lo, on_hi, enth_c, enth_ed);
         });
      }
   }
#endif

    //
    // Now we construct the actual fluxes: sum[ (species flux).(species enthalpy) ]
    //

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(TT,TilingIfNotGPU()); mfi.isValid(); ++mfi) {
#ifdef AMREX_USE_EB
        const Box &bx = mfi.tilebox();
        // this is to check efficiently if this tile contains any eb stuff
        const EBFArrayBox& in_fab = static_cast<EBFArrayBox const&>(TT[mfi]);
        const EBCellFlagFab& flags = in_fab.getEBCellFlagFab();

        if(flags.getType(amrex::grow(bx, 0)) == FabType::covered)
        {
            // If tile is completely covered by EB geometry, set
            // value to some very large number so we know if
            // we accidentaly use these covered vals later in calculations
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 1.2345e30;
                });
            }
        } else {
#endif
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir) {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_species_d  = (*flux[dir]).array(mfi, 0);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);
                auto const& enth_d          = enth_edgstate[dir].array(mfi);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 0.0;
                    for (int n = 0; n < NUM_SPECIES; n++) {
                        flux_enthaply_d(i,j,k) += flux_species_d(i,j,k,n)*enth_d(i,j,k,n);
                    }
                });
            }
#ifdef AMREX_USE_EB
        }
#endif
    }

    if (verbose > 3)
    {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;
      ParallelDescriptor::ReduceRealMax(run_time,IOProc);
      amrex::Print() << "      PeleLM::compute_enthalpy_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
    }
}